

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_buffer_clear(nk_buffer *b)

{
  if (b != (nk_buffer *)0x0) {
    b->allocated = 0;
    b->size = (b->memory).size;
    b->needed = 0;
    b->calls = 0;
    return;
  }
  __assert_fail("b",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                ,0x1fca,"void nk_buffer_clear(struct nk_buffer *)");
}

Assistant:

NK_API void
nk_buffer_clear(struct nk_buffer *b)
{
    NK_ASSERT(b);
    if (!b) return;
    b->allocated = 0;
    b->size = b->memory.size;
    b->calls = 0;
    b->needed = 0;
}